

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADE_DEP_DPFSP.cpp
# Opt level: O3

InfoInserzione __thiscall
ADE_DEP_DPFSP::miglioreInserzione
          (ADE_DEP_DPFSP *this,unsigned_short *vettoreFabbrica,
          unsigned_short dimensioneVettoreFabbrica,unsigned_short lavoroDaInserire)

{
  ushort uVar1;
  uint **ppuVar2;
  uint *puVar3;
  ulong uVar4;
  uint uVar5;
  uint *puVar6;
  void *pvVar7;
  void *pvVar8;
  undefined6 in_register_00000012;
  long lVar9;
  long lVar10;
  ulong uVar11;
  unsigned_short i;
  uint uVar12;
  undefined4 uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  unsigned_short fabbrica [1];
  undefined4 local_64;
  unsigned_short local_52;
  ulong local_50;
  ushort *local_48;
  uint *local_40;
  ulong local_38;
  
  if ((int)CONCAT62(in_register_00000012,dimensioneVettoreFabbrica) == 0) {
    local_52 = lavoroDaInserire;
    uVar5 = valutaIndividuoParziale(this,&local_52,1);
    uVar11 = 0;
  }
  else {
    uVar1 = (this->istanza).macchine;
    uVar11 = (ulong)uVar1;
    uVar16 = uVar11 * 4;
    local_48 = vettoreFabbrica;
    local_40 = (uint *)operator_new__(uVar16);
    puVar6 = (uint *)operator_new__(uVar16);
    pvVar7 = operator_new__((ulong)(this->istanza).lavori << 3);
    local_38 = (ulong)dimensioneVettoreFabbrica;
    uVar17 = (ulong)(dimensioneVettoreFabbrica - 1);
    ppuVar2 = (this->istanza).p;
    uVar14 = uVar17;
    local_50 = (ulong)uVar1;
    do {
      pvVar8 = operator_new__(uVar16);
      uVar4 = local_38;
      *(void **)((long)pvVar7 + uVar14 * 8) = pvVar8;
      if (local_50 != 0) {
        lVar9 = 0;
        do {
          lVar10 = lVar9 + -1;
          if (lVar9 == 0 || uVar14 == uVar17) {
            if (uVar14 == uVar17 && lVar9 != 0) {
              uVar15 = ppuVar2[local_48[uVar14]][uVar11 + lVar9 + -1] +
                       *(int *)((long)pvVar8 + lVar9 * 4 + uVar16);
            }
            else {
              if (lVar9 == 0 && uVar14 != uVar17) {
                puVar3 = *(uint **)((long)pvVar7 + uVar14 * 8 + 8);
                uVar15 = ppuVar2[local_48[uVar14]][uVar11 + lVar9 + -1];
                goto LAB_0010536c;
              }
              uVar15 = ppuVar2[local_48[uVar14]][uVar11 + lVar9 + -1];
            }
          }
          else {
            uVar5 = *(uint *)((long)pvVar8 + lVar9 * 4 + uVar16);
            uVar15 = *(uint *)(*(long *)((long)pvVar7 + uVar14 * 8 + 8) + uVar16 + -4 + lVar9 * 4);
            if (uVar15 < uVar5) {
              uVar15 = uVar5;
            }
            puVar3 = ppuVar2[local_48[uVar14]];
LAB_0010536c:
            uVar15 = uVar15 + puVar3[uVar11 + lVar9 + -1];
          }
          *(uint *)((long)pvVar8 + lVar10 * 4 + uVar16) = uVar15;
          lVar9 = lVar10;
        } while (1 < (long)((ulong)uVar1 + 1 + lVar10));
      }
      bVar18 = 0 < (long)uVar14;
      uVar14 = uVar14 - 1;
    } while (bVar18);
    uVar5 = 0xffffffff;
    uVar11 = 0;
    local_64 = 0;
    do {
      uVar15 = 0;
      if (local_50 != 0) {
        uVar14 = 0;
        do {
          if ((short)uVar14 == 0 && (short)uVar11 == 0) {
            *puVar6 = *ppuVar2[lavoroDaInserire];
            uVar15 = *ppuVar2[*local_48];
LAB_0010545f:
            *local_40 = uVar15;
          }
          else if (uVar14 == 0 && uVar11 != 0) {
            uVar15 = *local_40;
            *puVar6 = *ppuVar2[lavoroDaInserire] + uVar15;
            if (uVar11 != local_38) {
              uVar15 = uVar15 + *ppuVar2[local_48[uVar11]];
              goto LAB_0010545f;
            }
          }
          else {
            if (uVar14 == 0 || uVar11 != 0) {
              uVar15 = local_40[uVar14];
              uVar12 = puVar6[uVar14 - 1];
              if (puVar6[uVar14 - 1] <= uVar15) {
                uVar12 = uVar15;
              }
              puVar6[uVar14] = uVar12 + ppuVar2[lavoroDaInserire][uVar14];
              if (uVar11 == local_38) goto LAB_001054db;
              if (uVar15 < local_40[uVar14 - 1]) {
                uVar15 = local_40[uVar14 - 1];
              }
              uVar15 = uVar15 + ppuVar2[local_48[uVar11]][uVar14];
            }
            else {
              puVar6[uVar14] = ppuVar2[lavoroDaInserire][uVar14] + puVar6[uVar14 - 1];
              uVar15 = ppuVar2[*local_48][uVar14] + local_40[uVar14 - 1];
            }
            local_40[uVar14] = uVar15;
          }
LAB_001054db:
          uVar14 = uVar14 + 1;
        } while (local_50 != uVar14);
        uVar15 = 0;
        if (local_50 != 0) {
          uVar14 = 0;
          uVar15 = 0;
          do {
            uVar12 = puVar6[uVar14];
            if (uVar11 != local_38) {
              uVar12 = uVar12 + *(int *)(*(long *)((long)pvVar7 + uVar11 * 8) + uVar14 * 4);
            }
            if (uVar12 < uVar15) {
              uVar12 = uVar15;
            }
            uVar15 = uVar12;
            uVar14 = uVar14 + 1;
          } while (local_50 != uVar14);
        }
      }
      bVar18 = uVar15 < uVar5;
      if (bVar18) {
        uVar5 = uVar15;
      }
      uVar13 = (int)uVar11;
      if (!bVar18) {
        uVar13 = local_64;
      }
      uVar11 = uVar11 + 1;
      local_64 = uVar13;
    } while (uVar11 != ((int)local_38 + 1 + (uint)((short)local_38 == -1) & 0xffff));
    operator_delete__(local_40);
    operator_delete__(puVar6);
    uVar11 = 0;
    do {
      pvVar8 = *(void **)((long)pvVar7 + uVar11 * 8);
      if (pvVar8 != (void *)0x0) {
        operator_delete__(pvVar8);
      }
      uVar11 = uVar11 + 1;
    } while (uVar4 != uVar11);
    operator_delete__(pvVar7);
    local_64._0_2_ = (ushort)uVar13;
    uVar11 = (ulong)(ushort)local_64 << 0x20;
  }
  return (InfoInserzione)(uVar5 | uVar11);
}

Assistant:

ADE_DEP_DPFSP::InfoInserzione ADE_DEP_DPFSP::miglioreInserzione(unsigned short* vettoreFabbrica, 
	unsigned short dimensioneVettoreFabbrica,
	unsigned short lavoroDaInserire) {

	if (dimensioneVettoreFabbrica == 0) {
		unsigned short fabbrica[1] = { lavoroDaInserire };
		return { valutaIndividuoParziale(fabbrica, 1) , 0};
	}
		
	//Accelerazione di Taillard, guardare l'articolo relativo
	unsigned int* e = new unsigned int[istanza.macchine];
	unsigned int* f = new unsigned int[istanza.macchine];
	unsigned int** q = new unsigned int* [istanza.lavori];

	unsigned int miglioreMakespan = UINT32_MAX;
	unsigned short migliorePosizione = 0;

	for (int i = dimensioneVettoreFabbrica - 1; i >= 0; i--) {
		q[i] = new unsigned int[istanza.macchine];

		for (int j = istanza.macchine - 1; j >= 0; j--) {

			if (i != dimensioneVettoreFabbrica - 1 && j != istanza.macchine - 1) {
				q[i][j] = max(q[i][j + 1], q[i + 1][j]) + istanza.p[vettoreFabbrica[i]][j];
			}
			else if (i == dimensioneVettoreFabbrica - 1 && j != istanza.macchine - 1) {
				q[i][j] = q[i][j + 1] + istanza.p[vettoreFabbrica[i]][j];
			}
			else if (i != dimensioneVettoreFabbrica - 1 && j == istanza.macchine - 1) {
				q[i][j] = q[i + 1][j] + istanza.p[vettoreFabbrica[i]][j];
			}
			else {
				q[i][j] = istanza.p[vettoreFabbrica[i]][j];
			}	
		}
	}

	for (unsigned short i = 0; i <= dimensioneVettoreFabbrica; i++) {

		for (unsigned short j = 0; j < istanza.macchine; j++) {

			if (i == 0 && j == 0) {
				f[0] = istanza.p[lavoroDaInserire][0];
				e[0] = istanza.p[vettoreFabbrica[0]][0];
			}
			else if (i != 0 && j == 0) {
				f[0] = e[0] + istanza.p[lavoroDaInserire][0];

				if (i != dimensioneVettoreFabbrica)
					e[0] = e[0] + istanza.p[vettoreFabbrica[i]][0];
			}
			else if (i == 0 && j != 0) {
				f[j] = f[j - 1] + istanza.p[lavoroDaInserire][j];
				e[j] = e[j - 1] + istanza.p[vettoreFabbrica[0]][j];
			}
			else {
				f[j] = max(f[j - 1], e[j]) + istanza.p[lavoroDaInserire][j];
				if (i != dimensioneVettoreFabbrica)
					e[j] = max(e[j - 1], e[j]) + istanza.p[vettoreFabbrica[i]][j];
			}
		}

		unsigned int makeSpanParziale = 0;

		for (unsigned short j = 0; j < istanza.macchine; j++) {

			if (i != dimensioneVettoreFabbrica)
				makeSpanParziale = max(makeSpanParziale, f[j] + q[i][j]);
			else
				makeSpanParziale = max(makeSpanParziale, f[j]);
		}

		if (makeSpanParziale < miglioreMakespan) {
			miglioreMakespan = makeSpanParziale;
			migliorePosizione = i;
		}

	}

	delete[] e;
	delete[] f;

	for (unsigned short i = 0; i < dimensioneVettoreFabbrica; i++) {
		delete[] q[i];
	}

	delete[] q;

	return { miglioreMakespan, migliorePosizione };
}